

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# transform_load.cpp
# Opt level: O2

unique_ptr<duckdb::LoadStatement,_std::default_delete<duckdb::LoadStatement>,_true> __thiscall
duckdb::Transformer::TransformLoad(Transformer *this,PGLoadStmt *stmt)

{
  bool bVar1;
  int iVar2;
  _Head_base<0UL,_duckdb::LoadInfo_*,_false> _Var3;
  _Head_base<0UL,_duckdb::LoadInfo_*,_false> _Var4;
  pointer pLVar5;
  pointer pLVar6;
  LoadType LVar7;
  long in_RDX;
  allocator local_53;
  allocator local_52;
  allocator local_51;
  _Head_base<0UL,_duckdb::LoadInfo_*,_false> local_50;
  string local_48 [32];
  
  make_uniq<duckdb::LoadStatement>();
  make_uniq<duckdb::LoadInfo>();
  if (*(char **)(in_RDX + 8) == (char *)0x0) {
    ::std::__cxx11::string::string(local_48,anon_var_dwarf_4b0ffdd + 9,&local_51);
  }
  else {
    ::std::__cxx11::string::string(local_48,*(char **)(in_RDX + 8),&local_51);
  }
  pLVar5 = unique_ptr<duckdb::LoadInfo,_std::default_delete<duckdb::LoadInfo>,_true>::operator->
                     ((unique_ptr<duckdb::LoadInfo,_std::default_delete<duckdb::LoadInfo>,_true> *)
                      &local_50);
  ::std::__cxx11::string::operator=((string *)&pLVar5->filename,local_48);
  ::std::__cxx11::string::~string(local_48);
  if (*(char **)(in_RDX + 0x10) == (char *)0x0) {
    ::std::__cxx11::string::string(local_48,anon_var_dwarf_4b0ffdd + 9,&local_52);
  }
  else {
    ::std::__cxx11::string::string(local_48,*(char **)(in_RDX + 0x10),&local_52);
  }
  pLVar5 = unique_ptr<duckdb::LoadInfo,_std::default_delete<duckdb::LoadInfo>,_true>::operator->
                     ((unique_ptr<duckdb::LoadInfo,_std::default_delete<duckdb::LoadInfo>,_true> *)
                      &local_50);
  ::std::__cxx11::string::operator=((string *)&pLVar5->repository,local_48);
  ::std::__cxx11::string::~string(local_48);
  bVar1 = *(bool *)(in_RDX + 0x18);
  pLVar5 = unique_ptr<duckdb::LoadInfo,_std::default_delete<duckdb::LoadInfo>,_true>::operator->
                     ((unique_ptr<duckdb::LoadInfo,_std::default_delete<duckdb::LoadInfo>,_true> *)
                      &local_50);
  pLVar5->repo_is_alias = bVar1;
  if (*(char **)(in_RDX + 0x20) == (char *)0x0) {
    ::std::__cxx11::string::string(local_48,anon_var_dwarf_4b0ffdd + 9,&local_53);
  }
  else {
    ::std::__cxx11::string::string(local_48,*(char **)(in_RDX + 0x20),&local_53);
  }
  pLVar5 = unique_ptr<duckdb::LoadInfo,_std::default_delete<duckdb::LoadInfo>,_true>::operator->
                     ((unique_ptr<duckdb::LoadInfo,_std::default_delete<duckdb::LoadInfo>,_true> *)
                      &local_50);
  ::std::__cxx11::string::operator=((string *)&pLVar5->version,local_48);
  ::std::__cxx11::string::~string(local_48);
  iVar2 = *(int *)(in_RDX + 0x28);
  if (iVar2 == 0) {
    pLVar5 = unique_ptr<duckdb::LoadInfo,_std::default_delete<duckdb::LoadInfo>,_true>::operator->
                       ((unique_ptr<duckdb::LoadInfo,_std::default_delete<duckdb::LoadInfo>,_true> *
                        )&local_50);
    LVar7 = LOAD;
  }
  else if (iVar2 == 1) {
    pLVar5 = unique_ptr<duckdb::LoadInfo,_std::default_delete<duckdb::LoadInfo>,_true>::operator->
                       ((unique_ptr<duckdb::LoadInfo,_std::default_delete<duckdb::LoadInfo>,_true> *
                        )&local_50);
    LVar7 = INSTALL;
  }
  else {
    if (iVar2 != 2) goto LAB_0168d8ce;
    pLVar5 = unique_ptr<duckdb::LoadInfo,_std::default_delete<duckdb::LoadInfo>,_true>::operator->
                       ((unique_ptr<duckdb::LoadInfo,_std::default_delete<duckdb::LoadInfo>,_true> *
                        )&local_50);
    LVar7 = FORCE_INSTALL;
  }
  pLVar5->load_type = LVar7;
LAB_0168d8ce:
  pLVar6 = unique_ptr<duckdb::LoadStatement,_std::default_delete<duckdb::LoadStatement>,_true>::
           operator->((unique_ptr<duckdb::LoadStatement,_std::default_delete<duckdb::LoadStatement>,_true>
                       *)this);
  _Var4._M_head_impl = local_50._M_head_impl;
  local_50._M_head_impl = (LoadInfo *)0x0;
  _Var3._M_head_impl =
       (pLVar6->info).super_unique_ptr<duckdb::LoadInfo,_std::default_delete<duckdb::LoadInfo>_>.
       _M_t.super___uniq_ptr_impl<duckdb::LoadInfo,_std::default_delete<duckdb::LoadInfo>_>._M_t.
       super__Tuple_impl<0UL,_duckdb::LoadInfo_*,_std::default_delete<duckdb::LoadInfo>_>.
       super__Head_base<0UL,_duckdb::LoadInfo_*,_false>._M_head_impl;
  (pLVar6->info).super_unique_ptr<duckdb::LoadInfo,_std::default_delete<duckdb::LoadInfo>_>._M_t.
  super___uniq_ptr_impl<duckdb::LoadInfo,_std::default_delete<duckdb::LoadInfo>_>._M_t.
  super__Tuple_impl<0UL,_duckdb::LoadInfo_*,_std::default_delete<duckdb::LoadInfo>_>.
  super__Head_base<0UL,_duckdb::LoadInfo_*,_false>._M_head_impl = _Var4._M_head_impl;
  if (_Var3._M_head_impl != (LoadInfo *)0x0) {
    (**(code **)(*(long *)&(_Var3._M_head_impl)->super_ParseInfo + 8))();
    if (local_50._M_head_impl != (LoadInfo *)0x0) {
      (*((local_50._M_head_impl)->super_ParseInfo)._vptr_ParseInfo[1])();
    }
  }
  return (unique_ptr<duckdb::LoadStatement,_std::default_delete<duckdb::LoadStatement>_>)
         (unique_ptr<duckdb::LoadStatement,_std::default_delete<duckdb::LoadStatement>_>)this;
}

Assistant:

unique_ptr<LoadStatement> Transformer::TransformLoad(duckdb_libpgquery::PGLoadStmt &stmt) {
	D_ASSERT(stmt.type == duckdb_libpgquery::T_PGLoadStmt);

	auto load_stmt = make_uniq<LoadStatement>();
	auto load_info = make_uniq<LoadInfo>();
	load_info->filename = stmt.filename ? string(stmt.filename) : "";
	load_info->repository = stmt.repository ? string(stmt.repository) : "";
	load_info->repo_is_alias = stmt.repo_is_alias;
	load_info->version = stmt.version ? string(stmt.version) : "";
	switch (stmt.load_type) {
	case duckdb_libpgquery::PG_LOAD_TYPE_LOAD:
		load_info->load_type = LoadType::LOAD;
		break;
	case duckdb_libpgquery::PG_LOAD_TYPE_INSTALL:
		load_info->load_type = LoadType::INSTALL;
		break;
	case duckdb_libpgquery::PG_LOAD_TYPE_FORCE_INSTALL:
		load_info->load_type = LoadType::FORCE_INSTALL;
		break;
	}
	load_stmt->info = std::move(load_info);
	return load_stmt;
}